

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

int __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,char *__name)

{
  int iVar1;
  LinkType LVar2;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long lVar3;
  long lVar4;
  int iVar5;
  int v;
  int iVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  LinkType nilParent;
  LinkType local_3c;
  uint local_38;
  uint local_34;
  
  iVar6 = (int)__name;
  local_3c = -1;
  if (iVar6 == -1) {
    lVar3 = *(long *)this[2].rootNode;
    bVar9 = true;
    lVar7 = -1;
  }
  else {
    lVar7 = (long)iVar6;
    lVar3 = *(long *)this[2].rootNode;
    bVar9 = -1 < *(int *)(lVar3 + 0x18 + lVar7 * 0x20);
  }
  lVar7 = lVar7 * 0x20;
  iVar5 = *(int *)(lVar3 + 0x10 + lVar7);
  v = *(int *)(lVar3 + 0x14 + lVar7);
  if (iVar5 == -1) {
    transplant(this,iVar6,v,&local_3c);
    lVar3 = extraout_RAX;
LAB_0029d3a4:
    if (!bVar9) goto LAB_0029d3b7;
  }
  else {
    if (v == -1) {
      transplant(this,iVar6,iVar5,&local_3c);
      lVar3 = extraout_RAX_00;
      v = iVar5;
      goto LAB_0029d3a4;
    }
    do {
      iVar5 = v;
      lVar8 = (long)iVar5 * 0x20;
      v = *(int *)(lVar3 + 0x10 + lVar8);
    } while (v != -1);
    v = *(int *)(lVar3 + 0x14 + lVar8);
    local_34 = *(uint *)(lVar3 + 0x18 + lVar8);
    if ((local_34 & 0x7fffffff) - 1 == iVar6) {
      iVar1 = v;
      LVar2 = iVar5;
      if (v != -1) goto LAB_0029d3e9;
    }
    else {
      transplant(this,iVar5,v,&local_3c);
      lVar3 = *(long *)this[2].rootNode;
      iVar1 = *(int *)(lVar3 + 0x14 + lVar7);
      *(int *)(lVar3 + 0x14 + lVar8) = iVar1;
LAB_0029d3e9:
      *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) =
           *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) & 0x80000000 | iVar5 + 1U;
      LVar2 = local_3c;
    }
    local_3c = LVar2;
    local_38 = iVar5 + 1;
    transplant(this,iVar6,iVar5,&local_3c);
    lVar3 = *(long *)this[2].rootNode;
    iVar6 = *(int *)(lVar3 + 0x10 + lVar7);
    *(int *)(lVar3 + 0x10 + lVar8) = iVar6;
    lVar4 = (long)iVar6 * 0x20;
    *(uint *)(lVar3 + 0x18 + lVar4) = *(uint *)(lVar3 + 0x18 + lVar4) & 0x80000000 | local_38;
    *(uint *)(lVar3 + 0x18 + lVar8) =
         *(uint *)(lVar3 + 0x18 + lVar7) & 0x80000000 | *(uint *)(lVar3 + 0x18 + lVar8) & 0x7fffffff
    ;
    if ((int)local_34 < 0) goto LAB_0029d3b7;
  }
  deleteFixup(this,v,local_3c);
  lVar3 = extraout_RAX_01;
LAB_0029d3b7:
  return (int)lVar3;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }